

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTopologyRepresentation::IfcTopologyRepresentation
          (IfcTopologyRepresentation *this)

{
  *(undefined ***)&(this->super_IfcShapeModel).field_0xa0 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xa8 = 0;
  *(char **)&this->field_0xb0 = "IfcTopologyRepresentation";
  IfcShapeModel::IfcShapeModel(&this->super_IfcShapeModel,&PTR_construction_vtable_24__0073df78);
  (this->super_IfcShapeModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x73dee8;
  *(undefined8 *)&(this->super_IfcShapeModel).field_0xa0 = 0x73df60;
  *(undefined8 *)&(this->super_IfcShapeModel).super_IfcRepresentation.field_0x80 = 0x73df10;
  *(undefined8 *)&(this->super_IfcShapeModel).super_IfcRepresentation.field_0x90 = 0x73df38;
  return;
}

Assistant:

IfcTopologyRepresentation() : Object("IfcTopologyRepresentation") {}